

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_diag_m(REF_DBL *m,REF_DBL *d)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  REF_DBL *pRVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ulong uVar17;
  REF_DBL RVar18;
  double dStack_100;
  REF_DBL local_f8 [4];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  int local_b4;
  long local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  REF_DBL *local_80;
  ulong local_78;
  REF_DBL *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  REF_DBL local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0x7fefffffffffffff < (ulong)ABS(*m)) {
    return 3;
  }
  dVar14 = m[1];
  if (0x7fefffffffffffff < (ulong)ABS(dVar14)) {
    return 3;
  }
  dVar12 = m[2];
  if (0x7fefffffffffffff < (ulong)ABS(dVar12)) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[3])) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[4])) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[5])) {
    return 3;
  }
  local_f8[0] = dVar14 * dVar14 + dVar12 * dVar12;
  if (local_f8[0] < 0.0) {
    dStack_100 = 7.63704442387336e-318;
    local_f8[0] = sqrt(local_f8[0]);
  }
  else {
    local_f8[0] = SQRT(local_f8[0]);
  }
  dVar14 = local_f8[0] * 1e+20;
  if (dVar14 <= -dVar14) {
    dVar14 = -dVar14;
  }
  dVar12 = m[1];
  dVar13 = dVar12;
  if (dVar12 <= -dVar12) {
    dVar13 = -dVar12;
  }
  if (dVar13 < dVar14) {
    dVar13 = m[2];
    dVar16 = dVar13;
    if (dVar13 <= -dVar13) {
      dVar16 = -dVar13;
    }
    if (dVar16 < dVar14) {
      dVar12 = dVar12 / local_f8[0];
      dVar13 = dVar13 / local_f8[0];
      dVar14 = (dVar12 + dVar12) * m[4] + (m[5] - m[3]) * dVar13;
      *d = *m;
      dVar16 = dVar13 * dVar14;
      d[1] = m[3] + dVar16;
      d[2] = m[5] - dVar16;
      d[3] = 1.0;
      d[4] = 0.0;
      d[5] = 0.0;
      d[6] = 0.0;
      d[7] = dVar12;
      d[8] = dVar13;
      d[9] = 0.0;
      d[10] = dVar13;
      d[0xb] = -dVar12;
      local_f8[1] = m[4] - dVar14 * dVar12;
      goto LAB_00179789;
    }
  }
  *d = *m;
  d[1] = m[3];
  d[2] = m[5];
  d[3] = 1.0;
  d[4] = 0.0;
  d[5] = 0.0;
  d[6] = 0.0;
  d[7] = 1.0;
  d[8] = 0.0;
  d[9] = 0.0;
  d[10] = 0.0;
  d[0xb] = 1.0;
  local_f8[0] = m[1];
  local_f8[1] = m[4];
LAB_00179789:
  local_f8[2] = 0.0;
  local_80 = d + 3;
  local_b0 = 2;
  uVar3 = 0;
  uVar7 = 0;
  dVar14 = 0.0;
  dVar13 = 0.0;
  dVar12 = 0.0;
  local_a8 = 0.0;
  uStack_a0 = 0;
  do {
    dVar16 = d[uVar7];
    if (dVar16 <= -dVar16) {
      dVar16 = -dVar16;
    }
    dVar10 = local_f8[uVar7];
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    dVar15 = dVar10 + dVar16;
    if (dVar10 + dVar16 <= local_a8) {
      dVar15 = local_a8;
    }
    local_a8 = dVar15;
    uStack_a0 = 0;
    local_60 = uVar7;
    do {
      dVar16 = local_f8[local_60];
      if (dVar16 <= -dVar16) {
        dVar16 = -dVar16;
      }
      dVar16 = (dVar16 + dVar15) - dVar15;
      if (dVar16 <= -dVar16) {
        dVar16 = -dVar16;
      }
      if (dVar16 < 1e-14) goto LAB_00179859;
      local_60 = local_60 + 1;
    } while (local_60 != 3);
    local_60 = 3;
LAB_00179859:
    iVar4 = (int)local_60;
    local_68 = local_60 & 0xffffffff;
    local_78 = uVar3;
    if (uVar7 != (local_60 & 0xffffffff)) {
      local_70 = local_80 + (long)iVar4 * 3;
      iVar6 = 0;
      local_58 = uVar7;
      do {
        uVar2 = local_60;
        if (iVar6 == 0x1e) {
          dStack_100 = 7.64557199692058e-318;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 200,"ref_matrix_diag_m",1,"not converged");
          return 1;
        }
        local_d0 = d[uVar7];
        local_d8 = local_f8[uVar7];
        dVar16 = (d[uVar7 + 1] - local_d0) / (local_d8 + local_d8);
        dVar10 = dVar16 * dVar16 + 1.0;
        local_48 = dVar13;
        if (dVar10 < 0.0) {
          dStack_100 = 7.64089813591092e-318;
          local_c8 = dVar12;
          local_c0 = dVar14;
          local_98 = dVar16;
          dVar10 = sqrt(dVar10);
          dVar14 = local_c0;
          dVar12 = local_c8;
          dVar16 = local_98;
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar13 = -dVar10;
        uVar9 = -(ulong)(0.0 < dVar10);
        if (dVar16 < 0.0) {
          uVar17 = ~uVar9 & (ulong)dVar10;
          dVar15 = dVar13;
        }
        else {
          uVar17 = ~uVar9 & (ulong)dVar13;
          dVar15 = dVar10;
        }
        dVar15 = local_d8 / ((double)(uVar17 | uVar9 & (ulong)dVar15) + dVar16);
        d[uVar7] = dVar15;
        local_b4 = iVar6;
        if (dVar16 < 0.0) {
          dVar13 = (double)(~uVar9 & (ulong)dVar10 | (ulong)dVar13 & uVar9);
        }
        else {
          dVar13 = (double)(~uVar9 & (ulong)dVar13 | (ulong)dVar10 & uVar9);
        }
        local_d8 = local_d8 * (dVar16 + dVar13);
        d[uVar7 + 1] = local_d8;
        local_d0 = local_d0 - dVar15;
        if (uVar7 == 0) {
          d[local_b0] = d[local_b0] - local_d0;
        }
        local_50 = local_f8[uVar7 + 1];
        dVar16 = 0.0;
        dVar10 = 1.0;
        if ((int)uVar7 < (int)uVar2) {
          RVar18 = d[local_68];
          uVar7 = 0;
          dVar10 = 1.0;
          dVar13 = 1.0;
          pRVar8 = local_70;
          do {
            lVar5 = (long)iVar4 - uVar7;
            dVar15 = (&dStack_100)[lVar5];
            dVar11 = RVar18 * RVar18 + dVar15 * dVar15;
            if (dVar11 < 0.0) {
              uStack_90 = 0;
              dStack_100 = 7.64289416112012e-318;
              local_c8 = dVar13;
              local_c0 = dVar16;
              local_98 = dVar15;
              local_40 = dVar10;
              local_38 = RVar18;
              dVar11 = sqrt(dVar11);
              dVar14 = local_c0;
              dVar12 = local_c8;
              dVar15 = local_98;
              RVar18 = local_38;
              dVar13 = local_40;
            }
            else {
              dVar11 = SQRT(dVar11);
              dVar14 = dVar16;
              dVar12 = dVar13;
              dVar13 = dVar10;
            }
            local_f8[lVar5] = dVar14 * dVar11;
            dVar16 = dVar15 / dVar11;
            dVar10 = RVar18 / dVar11;
            dVar11 = d[lVar5 + -1];
            d[lVar5] = (dVar13 * dVar15 * dVar10 + dVar16 * dVar11) * dVar16 + RVar18 * dVar13;
            lVar5 = -3;
            do {
              dVar1 = pRVar8[lVar5 + 3];
              pRVar8[lVar5 + 3] = dVar16 * pRVar8[lVar5] + dVar10 * dVar1;
              pRVar8[lVar5] = pRVar8[lVar5] * dVar10 + dVar1 * -dVar16;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0);
            RVar18 = dVar11 * dVar10 + -dVar16 * dVar13 * dVar15;
            uVar7 = uVar7 + 1;
            pRVar8 = pRVar8 + -3;
          } while (uVar7 != (uint)(iVar4 + (int)uVar3));
        }
        uVar7 = local_58;
        iVar6 = local_b4 + 1;
        dVar13 = local_48 + local_d0;
        dVar15 = (local_50 * -dVar16 * dVar14 * dVar12 * local_f8[local_58]) / local_d8;
        dVar16 = dVar16 * dVar15;
        local_f8[local_58] = dVar16;
        d[uVar7] = dVar15 * dVar10;
        if (dVar16 <= -dVar16) {
          dVar16 = -dVar16;
        }
        dVar16 = (dVar16 + local_a8) - local_a8;
        if (dVar16 <= -dVar16) {
          dVar16 = -dVar16;
        }
      } while (1e-14 <= dVar16);
    }
    d[uVar7] = d[uVar7] + dVar13;
    uVar7 = uVar7 + 1;
    local_b0 = local_b0 + 1;
    uVar3 = (ulong)((int)local_78 - 1);
    if (uVar7 == 3) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_m(REF_DBL *m, REF_DBL *d) {
  REF_DBL L, u, v, s;
  REF_DBL e[3];

  REF_DBL f, tst1, tst2;
  REF_INT i, j, l, mm;
  REF_INT l1, l2;
  REF_DBL h, g, p, r, dl1;
  REF_DBL c, c2, c3, el1;
  REF_INT mml, ii, k;
  REF_DBL s2;

  /* potential for stack corruption, if inf or nan */
  if (!isfinite(m[0]) || !isfinite(m[1]) || !isfinite(m[2]) ||
      !isfinite(m[3]) || !isfinite(m[4]) || !isfinite(m[5])) {
    return REF_INVALID;
  }

  /* one rotation to make tridiagonal ( zero out m[2] ) */
  /* http://www.geometrictools.com/Documentation/EigenSymmetricNxN.pdf */
  /* Eigen System Solvers for Symmetric Matrices, David Eberly */

  L = sqrt(m[1] * m[1] + m[2] * m[2]);

  if (ref_math_divisible(m[1], L) && ref_math_divisible(m[2], L)) {
    u = m[1] / L;
    v = m[2] / L;
    s = 2.0 * u * m[4] + v * (m[5] - m[3]);

    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3] + v * s;
    ref_matrix_eig(d, 2) = m[5] - v * s;

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = u;
    ref_matrix_vec(d, 2, 1) = v;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = v;
    ref_matrix_vec(d, 2, 2) = -u;

    e[0] = L;
    e[1] = m[4] - u * s;
    e[2] = 0.0;
  } else {
    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3];
    ref_matrix_eig(d, 2) = m[5];

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = 1.0;
    ref_matrix_vec(d, 2, 1) = 0.0;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 0.0;
    ref_matrix_vec(d, 2, 2) = 1.0;

    e[0] = m[1];
    e[1] = m[4];
    e[2] = 0.0;
  }

  c3 = 0;
  s2 = 0; /* quiet -Wall used without set compiler warning */

  f = 0.0;
  tst1 = 0.0;
  e[2] = 0.0;

#define gridSign(a, b) (b >= 0 ? ABS(a) : -ABS(a))

  for (l = 0; l < 3; l++) { /* row_loop  */
    j = 0;
    h = ABS(d[l]) + ABS(e[l]);
    if (tst1 < h) tst1 = h;
    /* look for small sub-diagonal element */
    for (mm = l; mm < 3; mm++) { /*test_for_zero_e */
      tst2 = tst1 + ABS(e[mm]);
      if (ABS(tst2 - tst1) < 1.0e-14) break;
      /* e[2] is always zero, so there is no exit through the bottom of loop*/
    }
    if (mm != l) { /* l_not_equal_mm */
      do {
        j = j + 1;
        /* set error -- no convergence to an eigenvalue after 30 iterations */
        if (j > 30) {
          RSS(REF_FAILURE, "not converged");
        }
        /* form shift */
        l1 = l + 1;
        l2 = l1 + 1;
        g = d[l];
        p = (d[l1] - g) / (2.0 * e[l]);
        r = sqrt(p * p + 1.0);
        d[l] = e[l] / (p + gridSign(r, p));
        d[l1] = e[l] * (p + gridSign(r, p));
        dl1 = d[l1];
        h = g - d[l];
        if (l2 <= 2) {
          for (i = l2; i < 3; i++) {
            d[i] = d[i] - h;
          }
        }
        f = f + h;
        /* ql transformation */
        p = d[mm];
        c = 1.0;
        c2 = c;
        el1 = e[l1];
        s = 0.0;
        mml = mm - l;
        for (ii = 0; ii < mml; ii++) {
          c3 = c2;
          c2 = c;
          s2 = s;
          i = mm - ii - 1;
          g = c * e[i];
          h = c * p;
          r = sqrt(p * p + e[i] * e[i]);
          e[i + 1] = s * r;
          s = e[i] / r;
          c = p / r;
          p = c * d[i] - s * g;
          d[i + 1] = h + s * (c * g + s * d[i]);
          /* form vector */
          for (k = 0; k < 3; k++) {
            h = ref_matrix_vec(d, k, i + 1);
            ref_matrix_vec(d, k, i + 1) = s * ref_matrix_vec(d, k, i) + c * h;
            ref_matrix_vec(d, k, i) = c * ref_matrix_vec(d, k, i) - s * h;
          }
        }
        p = -s * s2 * c3 * el1 * e[l] / dl1;
        e[l] = s * p;
        d[l] = c * p;
        tst2 = tst1 + ABS(e[l]);
        if (ABS(tst2 - tst1) < 1.0e-14) break;
      } while (REF_TRUE); /* iterate */
    }                     /* l_not_equal_mm */
    d[l] = d[l] + f;
  } /* row_loop */

  return REF_SUCCESS;
}